

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O3

int xmlPythonFileWrite(void *context,char *buffer,int len)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  char *pcVar5;
  
  iVar2 = -1;
  if (context == (void *)0x0) {
    return -1;
  }
  plVar3 = (long *)PyUnicode_FromStringAndSize(buffer,(long)len);
  if (plVar3 == (long *)0x0) {
    return -1;
  }
  pcVar5 = "io_write";
  iVar1 = PyObject_HasAttrString(context,"io_write");
  if (iVar1 == 0) {
    pcVar5 = "write";
    iVar1 = PyObject_HasAttrString(context,"write");
    if (iVar1 == 0) {
      plVar4 = (long *)0x0;
      goto LAB_0013c288;
    }
  }
  plVar4 = (long *)_PyObject_CallMethod_SizeT(context,pcVar5,"(O)",plVar3);
LAB_0013c288:
  *plVar3 = *plVar3 + -1;
  if (*plVar3 == 0) {
    _Py_Dealloc(plVar3);
  }
  if (plVar4 == (long *)0x0) {
    puts("xmlPythonFileWrite: result is NULL");
  }
  else {
    if ((*(byte *)(plVar4[1] + 0xab) & 1) == 0) {
      if (plVar4 == (long *)&_Py_NoneStruct) {
        __Py_NoneStruct = __Py_NoneStruct + -1;
        if (__Py_NoneStruct != 0) {
          return len;
        }
        _Py_Dealloc(&_Py_NoneStruct);
        return len;
      }
      puts("xmlPythonFileWrite: result is not an Int nor None");
      iVar2 = -1;
    }
    else {
      iVar2 = PyLong_AsLong(plVar4);
    }
    *plVar4 = *plVar4 + -1;
    if (*plVar4 == 0) {
      _Py_Dealloc(plVar4);
    }
  }
  return iVar2;
}

Assistant:

static int
xmlPythonFileWrite (void * context, const char * buffer, int len) {
    PyObject *file;
    PyObject *string;
    PyObject *ret = NULL;
    int written = -1;

    file = (PyObject *) context;
    if (file == NULL) return(-1);
    string = PY_IMPORT_STRING_SIZE(buffer, len);
    if (string == NULL) return(-1);
    if (PyObject_HasAttrString(file, (char *) "io_write")) {
        ret = PyObject_CallMethod(file, (char *) "io_write", (char *) "(O)",
	                        string);
    } else if (PyObject_HasAttrString(file, (char *) "write")) {
        ret = PyObject_CallMethod(file, (char *) "write", (char *) "(O)",
	                        string);
    }
    Py_DECREF(string);
    if (ret == NULL) {
	printf("xmlPythonFileWrite: result is NULL\n");
	return(-1);
    } else if (PyLong_Check(ret)) {
	written = (int) PyLong_AsLong(ret);
	Py_DECREF(ret);
    } else if (ret == Py_None) {
	written = len;
	Py_DECREF(ret);
    } else {
	printf("xmlPythonFileWrite: result is not an Int nor None\n");
	Py_DECREF(ret);
    }
    return(written);
}